

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

int cookie_sort(void *p1,void *p2)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  
  lVar1 = *p1;
  lVar2 = *p2;
  if (*(char **)(lVar1 + 0x18) == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(*(char **)(lVar1 + 0x18));
  }
  if (*(char **)(lVar2 + 0x18) == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = strlen(*(char **)(lVar2 + 0x18));
  }
  if (sVar4 == sVar5) {
    if (*(char **)(lVar1 + 0x28) == (char *)0x0) {
      sVar4 = 0;
    }
    else {
      sVar4 = strlen(*(char **)(lVar1 + 0x28));
    }
    if (*(char **)(lVar2 + 0x28) == (char *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = strlen(*(char **)(lVar2 + 0x28));
    }
    if (sVar4 == sVar5) {
      if (*(char **)(lVar1 + 8) == (char *)0x0) {
        return 0;
      }
      if (*(char **)(lVar2 + 8) == (char *)0x0) {
        return 0;
      }
      iVar3 = strcmp(*(char **)(lVar1 + 8),*(char **)(lVar2 + 8));
      return iVar3;
    }
  }
  return (sVar4 < sVar5) - 1 | 1;
}

Assistant:

static int cookie_sort(const void *p1, const void *p2)
{
  struct Cookie *c1 = *(struct Cookie **)p1;
  struct Cookie *c2 = *(struct Cookie **)p2;
  size_t l1, l2;

  /* 1 - compare cookie path lengths */
  l1 = c1->path ? strlen(c1->path) : 0;
  l2 = c2->path ? strlen(c2->path) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1 ; /* avoid size_t <=> int conversions */

  /* 2 - compare cookie domain lengths */
  l1 = c1->domain ? strlen(c1->domain) : 0;
  l2 = c2->domain ? strlen(c2->domain) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1 ;  /* avoid size_t <=> int conversions */

  /* 3 - compare cookie names */
  if(c1->name && c2->name)
    return strcmp(c1->name, c2->name);

  /* sorry, can't be more deterministic */
  return 0;
}